

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeContainerFormatParser.cpp
# Opt level: O2

void __thiscall
xe::ContainerFormatParser::parseContainerValue(ContainerFormatParser *this,string *dst,int *offset)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  
  iVar3 = *offset;
  uVar2 = getChar(this,iVar3);
  if (uVar2 != 0x27) {
    bVar1 = false;
    uVar4 = 0;
    if (uVar2 != 0x22) goto LAB_0011594c;
  }
  *offset = iVar3 + 1;
  bVar1 = true;
  uVar4 = uVar2;
LAB_0011594c:
  dst->_M_string_length = 0;
  *(dst->_M_dataplus)._M_p = '\0';
  iVar3 = *offset;
  while ((iVar3 < this->m_elementLen && (uVar2 = getChar(this,iVar3), 1 < uVar2 + 1))) {
    if (bVar1) {
      if (uVar2 == uVar4) goto LAB_001159ac;
    }
    else if ((uVar2 < 0x21) && ((0x100002400U >> ((ulong)uVar2 & 0x3f) & 1) != 0)) {
      return;
    }
    std::__cxx11::string::push_back((char)dst);
    iVar3 = *offset + 1;
    *offset = iVar3;
  }
  if (bVar1) {
LAB_001159ac:
    uVar2 = getChar(this,iVar3);
    if (uVar2 == uVar4) {
      *offset = iVar3 + 1;
    }
  }
  return;
}

Assistant:

void ContainerFormatParser::parseContainerValue (std::string& dst, int& offset) const
{
	DE_ASSERT(offset < m_elementLen);

	bool	isString	= getChar(offset) == '"' || getChar(offset) == '\'';
	int		quotChar	= isString ? getChar(offset) : 0;

	if (isString)
		offset += 1;

	dst.clear();

	for (;;)
	{
		int		curChar		= offset < m_elementLen ? getChar(offset) : 0;
		bool	isEnd		= curChar == 0 || curChar == (int)END_OF_BUFFER ||
							  (isString ? (curChar == quotChar) : (curChar == ' ' || curChar == '\n' || curChar == '\r'));

		if (isEnd)
			break;
		else
		{
			// \todo [2012-06-09 pyry] Escapes.
			dst.push_back((char)curChar);
		}

		offset += 1;
	}

	if (isString && getChar(offset) == quotChar)
		offset += 1;
}